

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDFObjectHandle
trap_oh_errors<QPDFObjectHandle>
          (qpdf_data qpdf,function<QPDFObjectHandle_()> *fallback,
          function<QPDFObjectHandle_(_qpdf_data_*)> *fn)

{
  uint uVar1;
  element_type *this;
  element_type *peVar2;
  element_type *this_00;
  element_type *peVar3;
  char *cstr;
  Pipeline *this_01;
  function<QPDFObjectHandle_(_qpdf_data_*)> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar4;
  shared_ptr<QPDFLogger> local_e0;
  QPDFLogger local_d0;
  int local_bc;
  string local_b8;
  qpdf_error_code_e local_98 [4];
  anon_class_40_2_c964147e local_88;
  function<void_(_qpdf_data_*)> local_60;
  uint local_3c;
  undefined1 local_38 [4];
  QPDF_ERROR_CODE status;
  QPDFObjectHandle ret;
  function<QPDFObjectHandle_(_qpdf_data_*)> *fn_local;
  function<QPDFObjectHandle_()> *fallback_local;
  qpdf_data qpdf_local;
  
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_38);
  local_88.ret = (QPDFObjectHandle *)local_38;
  std::function<QPDFObjectHandle_(_qpdf_data_*)>::function(&local_88.fn,in_RCX);
  std::function<void(_qpdf_data*)>::
  function<trap_oh_errors<QPDFObjectHandle>(_qpdf_data*,std::function<QPDFObjectHandle()>,std::function<QPDFObjectHandle(_qpdf_data*)>)::_lambda(_qpdf_data*)_1_,void>
            ((function<void(_qpdf_data*)> *)&local_60,&local_88);
  uVar1 = trap_errors((qpdf_data)fallback,&local_60);
  std::function<void_(_qpdf_data_*)>::~function(&local_60);
  trap_oh_errors<QPDFObjectHandle>(_qpdf_data*,std::function<QPDFObjectHandle()>,std::function<QPDFObjectHandle(_qpdf_data*)>)
  ::{lambda(_qpdf_data*)#1}::~function((_lambda__qpdf_data___1_ *)&local_88);
  local_3c = uVar1;
  if ((uVar1 & 2) == 0) {
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)qpdf,(QPDFObjectHandle *)local_38);
  }
  else {
    if (((ulong)fallback[5].super__Function_base._M_manager & 1) == 0) {
      QTC::TC("qpdf","qpdf-c warn about oh error",
              (uint)(((ulong)fallback[5].super__Function_base._M_manager & 0x100) == 0));
      if (((ulong)fallback[5].super__Function_base._M_manager & 0x100) == 0) {
        local_98[0] = qpdf_e_internal;
        this = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          fallback);
        QPDF::getFilename_abi_cxx11_(&local_b8,this);
        local_bc = 0;
        std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
        emplace_back<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                  ((list<QPDFExc,std::allocator<QPDFExc>> *)(fallback + 2),local_98,&local_b8,
                   (char (*) [1])0x42fa76,&local_bc,
                   (char (*) [129])
                   "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                  );
        std::__cxx11::string::~string((string *)&local_b8);
        *(undefined1 *)((long)&fallback[5].super__Function_base._M_manager + 1) = 1;
      }
      QPDFLogger::defaultLogger();
      peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_e0);
      QPDFLogger::getError(&local_d0,SUB81(peVar2,0));
      this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&local_d0);
      peVar3 = std::__shared_ptr_access<QPDFExc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFExc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          (fallback + 1));
      cstr = (char *)(**(code **)(*(long *)peVar3 + 0x10))();
      this_01 = Pipeline::operator<<(this_00,cstr);
      Pipeline::operator<<(this_01,"\n");
      std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_d0);
      std::shared_ptr<QPDFLogger>::~shared_ptr(&local_e0);
    }
    std::function<QPDFObjectHandle_()>::operator()((function<QPDFObjectHandle_()> *)qpdf);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)qpdf;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static RET
trap_oh_errors(qpdf_data qpdf, std::function<RET()> fallback, std::function<RET(qpdf_data)> fn)
{
    // Note: fallback is a function so we don't have to evaluate it unless needed. This is important
    // because sometimes the fallback creates an object.
    RET ret;
    QPDF_ERROR_CODE status = trap_errors(qpdf, [&ret, fn](qpdf_data q) { ret = fn(q); });
    if (status & QPDF_ERRORS) {
        if (!qpdf->silence_errors) {
            QTC::TC("qpdf", "qpdf-c warn about oh error", qpdf->oh_error_occurred ? 0 : 1);
            if (!qpdf->oh_error_occurred) {
                qpdf->warnings.emplace_back(
                    qpdf_e_internal,
                    qpdf->qpdf->getFilename(),
                    "",
                    0,
                    "C API function caught an exception that it isn't returning; please point the "
                    "application developer to ERROR HANDLING in qpdf-c.h");
                qpdf->oh_error_occurred = true;
            }
            *QPDFLogger::defaultLogger()->getError() << qpdf->error->what() << "\n";
        }
        return fallback();
    }
    return ret;
}